

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::GetBlock
          (TPZBlockDiagonal<std::complex<double>_> *this,int64_t i,
          TPZFMatrix<std::complex<double>_> *block)

{
  long lVar1;
  complex<double> *pcVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  
  lVar7 = (this->fBlockPos).fStore[i];
  lVar4 = (long)(this->fBlockSize).fStore[i];
  (*(block->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(block,lVar4,lVar4);
  if (0 < lVar4) {
    lVar7 = lVar7 << 4;
    lVar5 = 0;
    do {
      lVar6 = 0;
      lVar8 = lVar7;
      do {
        puVar9 = (undefined8 *)(((this->fStorage).fStore)->_M_value + lVar8);
        lVar1 = (block->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar5) ||
           ((block->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar2 = block->fElem;
        uVar3 = puVar9[1];
        *(undefined8 *)pcVar2[lVar1 * lVar6 + lVar5]._M_value = *puVar9;
        *(undefined8 *)(pcVar2[lVar1 * lVar6 + lVar5]._M_value + 8) = uVar3;
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + lVar4 * 0x10;
      } while (lVar4 != lVar6);
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar5 != lVar4);
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::GetBlock(int64_t i, TPZFMatrix<TVar> &block){
    int64_t firstpos = fBlockPos[i];
    int64_t bsize = fBlockSize[i];
    block.Redim(bsize,bsize);
    int64_t r,c;
    for(r=0; r<bsize; r++) {
        for(c=0; c<bsize; c++) {
            block(r,c) = fStorage[firstpos+r+bsize*c];
        }
    }
}